

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::qualified
               (ScopedNameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  Compilation *this;
  SystemSubroutine *pSVar1;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  NameComponents name_00;
  NameComponents name_01;
  string_view arg;
  string_view name_02;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_01;
  bool bVar2;
  NameSyntax *name_03;
  Symbol *pSVar3;
  Diagnostic *this_00;
  RootSymbol *pRVar4;
  ulong uVar5;
  LookupResult *scope;
  LookupResult *scope_00;
  LookupResult *scope_01;
  SymbolIndex SVar6;
  LookupResult *in_R9;
  string_view name_04;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_02;
  string_view name_05;
  SourceRange range_00;
  SourceRange range_01;
  LookupLocation location;
  SourceRange range_02;
  LookupLocation location_00;
  underlying_type in_stack_fffffffffffffb68;
  bitmask<slang::ast::LookupFlags> flags_00;
  undefined4 in_stack_fffffffffffffb6c;
  int colonParts;
  SyntaxKind firstKind;
  string_view name;
  NameComponents first;
  anon_class_40_5_f337d8d5 popFront;
  undefined7 uStack_3d7;
  undefined7 uStack_3b7;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  LookupResult originalResult;
  
  colonParts = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_ =
       (pointer)nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                firstElement;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.cap = 4;
  name_03 = anon_unknown_39::splitScopedName
                      (syntax,&nameParts.
                               super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>
                       ,&colonParts);
  firstKind = (name_03->super_ExpressionSyntax).super_SyntaxNode.kind;
  anon_unknown_39::NameComponents::NameComponents(&first,name_03);
  popFront.name = &name;
  name._M_len = first.text._M_len;
  name._M_str = first.text._M_str;
  popFront.firstKind = &firstKind;
  scope_00 = (LookupResult *)(context->scope).ptr;
  this = (Compilation *)scope_00->found;
  popFront.first = &first;
  popFront.nameParts = &nameParts;
  popFront.colonParts = &colonParts;
  if (firstKind == LocalScope) {
    if ((context->randomizeDetails == (RandomizeDetails *)0x0) ||
       (context->randomizeDetails->classType == (Scope *)0x0)) {
      sourceRange_01.endLoc = first.range.endLoc;
      sourceRange_01.startLoc = first.range.startLoc;
      LookupResult::addDiag(result,(Scope *)scope_00,(DiagCode)0x18000a,sourceRange_01);
      scope = scope_00;
      goto LAB_002e5cb5;
    }
    qualified::anon_class_40_5_f337d8d5::operator()(&popFront);
  }
  scope = (LookupResult *)name._M_len;
  if (name._M_len == 0) goto LAB_002e5cb5;
  uVar5 = (ulong)(firstKind - ArrayAndMethod);
  flags_00.m_bits = first.range.startLoc._0_4_;
  if (firstKind - ArrayAndMethod < 0x35) {
    if ((0x1bUL >> (uVar5 & 0x3f) & 1) != 0) {
LAB_002e59ca:
      sourceRange_02.endLoc = first.range.endLoc;
      sourceRange_02.startLoc = first.range.startLoc;
      this_00 = LookupResult::addDiag(result,(Scope *)scope_00,(DiagCode)0x35000a,sourceRange_02);
      arg._M_str = name._M_str;
      arg._M_len = name._M_len;
      scope = (LookupResult *)name._M_len;
      Diagnostic::operator<<(this_00,arg);
      goto LAB_002e5cb5;
    }
    if (uVar5 != 0x34) goto LAB_002e58c8;
LAB_002e5a05:
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_3b7;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
    in_stack_fffffffffffffb6c = first.range.startLoc._4_4_;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc = first.range.endLoc
    ;
    sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
         first.range.startLoc;
    name_04._M_str = name._M_str;
    name_04._M_len = name._M_len;
    location.index = context->lookupIndex;
    location.scope = (Scope *)uVar5;
    location._12_4_ = 0;
    unqualifiedImpl((Scope *)scope_00,name_04,location,sourceRange,flags,0,result,(Scope *)scope_00,
                    (SyntaxNode *)0x0);
    in_stack_fffffffffffffb68 = flags_00.m_bits;
  }
  else {
LAB_002e58c8:
    uVar5 = (ulong)(firstKind - IdentifierName);
    if (firstKind - IdentifierName < 2) goto LAB_002e5a05;
    if (firstKind == ConstructorName) goto LAB_002e59ca;
    if (firstKind == LocalScope) goto LAB_002e5cb5;
    if (firstKind == RootScope) {
      bVar2 = Scope::isUninstantiated((Scope *)scope_00);
      if (!bVar2) {
        pRVar4 = Compilation::getRoot(this);
        result->found = &pRVar4->super_Symbol;
        nameParts_00._M_extent._M_extent_value =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
        nameParts_00._M_ptr =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_;
        name_00.text._M_str = first.text._M_str;
        name_00.text._M_len = first.text._M_len;
        name_00.range.startLoc = first.range.startLoc;
        name_00.range.endLoc._0_4_ = first.range.endLoc._0_4_;
        name_00.range.endLoc._4_4_ = first.range.endLoc._4_4_;
        name_00.selectors._M_ptr = first.selectors._M_ptr;
        name_00.selectors._M_extent._M_extent_value = first.selectors._M_extent._M_extent_value;
        name_00.paramAssignments = first.paramAssignments;
        scope = (LookupResult *)
                nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
        anon_unknown_39::lookupDownward(nameParts_00,name_00,context,flags,result);
      }
      goto LAB_002e5cb5;
    }
    if (firstKind == SuperHandle) {
      scope = (LookupResult *)(ulong)flags.m_bits;
      range_02.endLoc = (SourceLocation)result;
      range_02.startLoc = first.range.endLoc;
      pSVar3 = anon_unknown_39::findSuperHandle
                         ((anon_unknown_39 *)scope_00,(Scope *)scope,flags_00,range_02,in_R9);
LAB_002e5adf:
      result->found = pSVar3;
      colonParts = 1;
    }
    else if (firstKind == ThisHandle) {
      scope = (LookupResult *)(ulong)flags.m_bits;
      range_00.endLoc = (SourceLocation)result;
      range_00.startLoc = first.range.endLoc;
      pSVar3 = anon_unknown_39::findThisHandle
                         ((anon_unknown_39 *)scope_00,(Scope *)scope,flags_00,range_00,in_R9);
      result->found = pSVar3;
      if ((pSVar3 != (Symbol *)0x0) &&
         (nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
          [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len - 1].
          kind == SuperHandle)) {
        first.text._M_len =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.text._M_len;
        first.text._M_str =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.text._M_str;
        first.range.startLoc =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.range.startLoc;
        first.range.endLoc =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.range.endLoc;
        first.selectors._M_ptr =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.selectors._M_ptr;
        first.selectors._M_extent._M_extent_value =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.selectors._M_extent._M_extent_value;
        first.paramAssignments =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             [nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len -
              1].name.paramAssignments;
        nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len - 1
        ;
        scope = (LookupResult *)(ulong)flags.m_bits;
        range_01.endLoc = (SourceLocation)result;
        range_01.startLoc = first.range.endLoc;
        pSVar3 = anon_unknown_39::findSuperHandle
                           ((anon_unknown_39 *)scope_00,(Scope *)scope,
                            (bitmask<slang::ast::LookupFlags>)first.range.startLoc._0_4_,range_01,
                            in_R9);
        goto LAB_002e5adf;
      }
    }
    else {
      qualified::anon_class_40_5_f337d8d5::operator()(&popFront);
      scope = (LookupResult *)name._M_len;
      if (name._M_len == 0) goto LAB_002e5cb5;
      SVar6 = context->lookupIndex;
      scope_01 = scope_00;
      do {
        pSVar1 = scope_01->systemSubroutine;
        if (*(int *)&pSVar1->_vptr_SystemSubroutine == 3) {
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_3d7;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
          in_stack_fffffffffffffb68 = first.range.startLoc._0_4_;
          in_stack_fffffffffffffb6c = first.range.startLoc._4_4_;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
               first.range.endLoc;
          sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
               first.range.startLoc;
          name_05._M_str = name._M_str;
          name_05._M_len = name._M_len;
          location_00.index = SVar6;
          location_00.scope = (Scope *)uVar5;
          location_00._12_4_ = 0;
          unqualifiedImpl((Scope *)scope_01,name_05,location_00,sourceRange_00,flags,0,result,
                          (Scope *)scope_00,(SyntaxNode *)0x0);
          break;
        }
        scope_01 = *(LookupResult **)((long)&(pSVar1->name).field_2 + 8);
        SVar6 = *(int *)&pSVar1->hasOutputArgs + 1;
      } while (scope_01 != (LookupResult *)0x0);
    }
  }
  bVar2 = LookupResult::hasError(result);
  if (bVar2) goto LAB_002e5cb5;
  scope = (LookupResult *)(ulong)(uint)colonParts;
  if (colonParts != 0) {
    anon_unknown_39::resolveColonNames
              (&nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
               colonParts,&first,flags,result,context);
    goto LAB_002e5cb5;
  }
  originalResult.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)originalResult.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  originalResult.found = (Symbol *)0x0;
  originalResult.systemSubroutine._0_5_ = 0;
  originalResult.systemSubroutine._5_3_ = 0;
  originalResult.upwardCount = 0;
  originalResult.flags.m_bits = '\0';
  originalResult.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  originalResult.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  originalResult.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)originalResult.path.
                super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.firstElement;
  originalResult.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  originalResult.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  originalResult.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  if (result->found == (Symbol *)0x0) {
LAB_002e5bea:
    nameParts_02._M_extent._M_extent_value = (size_t)&first;
    nameParts_02._M_ptr =
         (pointer)nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                  len;
    scope = (LookupResult *)
            nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
    bVar2 = anon_unknown_39::lookupUpward
                      ((anon_unknown_39 *)
                       nameParts.
                       super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_,
                       nameParts_02,(NameComponents *)context,(ASTContext *)(ulong)flags.m_bits,
                       (bitmask<slang::ast::LookupFlags>)(underlying_type)result,
                       (LookupResult *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                      );
    if (bVar2 && result->found == (Symbol *)0x0) {
      scope = &originalResult;
      LookupResult::operator=(result,scope);
      if ((result->found == (Symbol *)0x0) && (bVar2 = LookupResult::hasError(result), !bVar2)) {
        name_02._M_str = name._M_str;
        name_02._M_len = name._M_len;
        range.endLoc = first.range.endLoc;
        range.startLoc = first.range.startLoc;
        scope = (LookupResult *)name._M_len;
        reportUndeclared((Scope *)scope_00,name_02,range,
                         (bitmask<slang::ast::LookupFlags>)(flags.m_bits | 0x10),true,result);
      }
    }
  }
  else {
    nameParts_01._M_extent._M_extent_value =
         nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
    nameParts_01._M_ptr =
         nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_;
    in_stack_fffffffffffffb68 = (underlying_type)first.text._M_len;
    in_stack_fffffffffffffb6c = (undefined4)(first.text._M_len >> 0x20);
    name_01.text._M_str = first.text._M_str;
    name_01.text._M_len = first.text._M_len;
    name_01.range.startLoc = first.range.startLoc;
    name_01.range.endLoc._0_4_ = first.range.endLoc._0_4_;
    name_01.range.endLoc._4_4_ = first.range.endLoc._4_4_;
    name_01.selectors._M_ptr = first.selectors._M_ptr;
    name_01.selectors._M_extent._M_extent_value = first.selectors._M_extent._M_extent_value;
    name_01.paramAssignments = first.paramAssignments;
    scope = (LookupResult *)
            nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
    bVar2 = anon_unknown_39::lookupDownward(nameParts_01,name_01,context,flags,result);
    if ((bVar2 && result->found == (Symbol *)0x0) && (((result->flags).m_bits & 1) == 0)) {
      LookupResult::operator=(&originalResult,result);
      goto LAB_002e5bea;
    }
  }
  LookupResult::~LookupResult(&originalResult);
LAB_002e5cb5:
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
            (&nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
             (EVP_PKEY_CTX *)scope);
  return;
}

Assistant:

void Lookup::qualified(const ScopedNameSyntax& syntax, const ASTContext& context,
                       bitmask<LookupFlags> flags, LookupResult& result) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    auto leftMost = splitScopedName(syntax, nameParts, colonParts);

    SyntaxKind firstKind = leftMost->kind;
    NameComponents first = *leftMost;
    auto name = first.text;

    auto popFront = [&] {
        first = nameParts.back().name;
        firstKind = nameParts.back().kind;
        nameParts.pop_back();
        name = first.text;
        if (colonParts)
            colonParts--;
    };

    auto& scope = *context.scope;
    auto& compilation = context.getCompilation();

    if (firstKind == SyntaxKind::LocalScope) {
        if (!context.randomizeDetails || !context.randomizeDetails->classType) {
            result.addDiag(scope, diag::LocalNotAllowed, first.range);
            return;
        }

        // The local:: is allowed here. Pop it and look up the rest of
        // the name as if the local hadn't been specified -- the local
        // lookup portion has already been ensured because we exited
        // early from withinClassRandomize.
        popFront();
    }

    if (name.empty())
        return;

    switch (firstKind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            // Start by trying to find the first name segment using normal unqualified lookup
            unqualifiedImpl(scope, name, context.getLocation(), first.range, flags, {}, result,
                            scope, nullptr);
            break;
        case SyntaxKind::UnitScope: {
            // Walk upward to find the compilation unit scope.
            popFront();
            if (name.empty())
                return;

            const Scope* current = &scope;
            LookupLocation location = context.getLocation();
            do {
                auto& symbol = current->asSymbol();
                if (symbol.kind == SymbolKind::CompilationUnit) {
                    unqualifiedImpl(*current, name, location, first.range, flags, {}, result, scope,
                                    nullptr);
                    break;
                }

                location = LookupLocation::after(symbol);
                current = location.getScope();
            } while (current);

            break;
        }
        case SyntaxKind::RootScope:
            // Ignore hierarchical lookups that occur inside uninstantiated modules.
            if (scope.isUninstantiated())
                return;

            result.found = &compilation.getRoot();
            lookupDownward(nameParts, first, context, flags, result);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, first.range, result);
            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                first = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(scope, flags, first.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(scope, flags, first.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        case SyntaxKind::LocalScope:
            // This is only reachable in invalid code. An error has already been
            // reported so early out.
            return;
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, first.range) << name;
            return;
        default:
            SLANG_UNREACHABLE;
    }

    if (result.hasError())
        return;

    // [23.7.1] If we are starting with a colon separator, always do a downwards name
    // resolution.
    if (colonParts) {
        resolveColonNames(nameParts, colonParts, first, flags, result, context);
        return;
    }

    // [23.7] lists the possible cases for dotted names:
    // 1. The name resolves to a value symbol. The dotted name is a member select.
    // 2. The name resolves to a local scope. The dotted name is a hierarchical reference.
    // 3. The name resolves to an imported scope. The dotted name is a hierarchical reference,
    //    but with an added restriction that only a direct downward lookup from the package is
    //    allowed.
    // 4. The name is not found; it's considered a hierarchical reference and participates in
    //    upwards name resolution.

    LookupResult originalResult;
    if (result.found) {
        // Perform the downward lookup.
        if (!lookupDownward(nameParts, first, context, flags, result))
            return;

        // If we found a symbol, we're done with lookup. In case (1) above we'll always have a
        // found symbol here. Otherwise, if we're in case (2) we need to do further upwards name
        // lookup. If we're in case (3) we've already issued an error and just need to give up.
        if (result.found || result.flags.has(LookupResultFlags::WasImported))
            return;

        originalResult = result;
    }

    // If we reach this point we're in case (2) or (4) above. Go up through the instantiation
    // hierarchy and see if we can find a match there.
    if (!lookupUpward(nameParts, first, context, flags, result))
        return;

    if (result.found)
        return;

    // We couldn't find anything. originalResult has any diagnostics issued by the first
    // downward lookup (if any), so it's fine to just return it as is. If we never found any
    // symbol originally, issue an appropriate error for that.
    result = originalResult;
    if (!result.found && !result.hasError()) {
        reportUndeclared(scope, name, first.range,
                         flags | LookupFlags::NoUndeclaredErrorIfUninstantiated, true, result);
    }
}